

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardFileIterator.h
# Opt level: O3

void __thiscall
bwtil::BackwardFileIterator::BackwardFileIterator(BackwardFileIterator *this,string *path)

{
  FILE *__stream;
  ulong uVar1;
  symbol *psVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 extraout_var [56];
  
  (this->super_BackwardIterator)._vptr_BackwardIterator =
       (_func_int **)&PTR__BackwardFileIterator_00122cf0;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  auVar8._0_8_ = std::__cxx11::string::_M_assign((string *)&this->path);
  auVar8._8_56_ = extraout_var;
  auVar7 = auVar8._0_16_;
  __stream = fopen((path->_M_dataplus)._M_p,"rb");
  this->fp = (FILE *)__stream;
  if (__stream == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error while opening file ",0x19);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    fseek(__stream,0,2);
    uVar1 = ftell((FILE *)this->fp);
    this->n = uVar1;
    if (uVar1 != 0) {
      auVar7 = vcvtusi2sd_avx512f(auVar7,uVar1 + 1);
      dVar6 = log2(auVar7._0_8_);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar6 * dVar6;
      uVar4 = vcvttsd2usi_avx512f(auVar7);
      uVar5 = 1;
      if (uVar4 <= uVar1) {
        uVar5 = uVar1 / uVar4;
      }
      this->bufferSize = uVar5;
      psVar2 = (symbol *)operator_new__(uVar5);
      this->buffer = psVar2;
      (*(this->super_BackwardIterator)._vptr_BackwardIterator[2])(this);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error: file ",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," has length 0.",0xe);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  exit(0);
}

Assistant:

BackwardFileIterator(string &path){

		this->path=path;

		fp = fopen(path.c_str(), "rb");

		if (fp == NULL){
		  cout << "Error while opening file " << path <<endl;
		  exit(0);
		}

		fseek(fp, 0, SEEK_END);
		n = ftell(fp);

		if (n == 0){
		  cout << "Error: file " << path << " has length 0." << endl;
		  exit(0);
		}

		bufferSize = n/(ulint)(log2(n+1)*log2(n+1));//read file in chunks of n/log^2 n bytes (in total log^2 n sequential reads of the file)
		if(bufferSize==0)
			bufferSize = 1;

		buffer = new symbol[bufferSize];

		/*cout << "bufferSize="<<bufferSize<<endl;
		cout << "txt len="<<n<<endl;*/

		rewind();

	}